

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int unres_schema_find(unres_schema *unres,int start_on_backwards,void *item,UNRES_ITEM type)

{
  long *plVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar3 = 0xffffffff;
  if (unres->count != 0) {
    uVar3 = unres->count - 1;
    if (-1 < start_on_backwards) {
      uVar3 = start_on_backwards;
    }
    if (-1 < (int)uVar3) {
      uVar5 = (ulong)uVar3;
      do {
        if (unres->type[uVar5] == type) {
          plVar1 = (long *)unres->item[uVar5];
          if (type == UNRES_LIST_UNIQ) {
            if ((*plVar1 == *item) &&
               (iVar4 = ly_strequal_((char *)plVar1[1],*(char **)((long)item + 8)), iVar4 != 0)) {
LAB_0011abd7:
              return (int)uVar5;
            }
          }
          else if (plVar1 == (long *)item) goto LAB_0011abd7;
        }
        bVar2 = 0 < (long)uVar5;
        uVar5 = uVar5 - 1;
        uVar3 = 0xffffffff;
      } while (bVar2);
    }
  }
  return uVar3;
}

Assistant:

int
unres_schema_find(struct unres_schema *unres, int start_on_backwards, void *item, enum UNRES_ITEM type)
{
    int i;
    struct unres_list_uniq *aux_uniq1, *aux_uniq2;

    if (!unres->count) {
        return -1;
    }

    if (start_on_backwards >= 0) {
        i = start_on_backwards;
    } else {
        i = unres->count - 1;
    }
    for (; i > -1; i--) {
        if (unres->type[i] != type) {
            continue;
        }
        if (type != UNRES_LIST_UNIQ) {
            if (unres->item[i] == item) {
                break;
            }
        } else {
            aux_uniq1 = (struct unres_list_uniq *)unres->item[i];
            aux_uniq2 = (struct unres_list_uniq *)item;
            if ((aux_uniq1->list == aux_uniq2->list) && ly_strequal(aux_uniq1->expr, aux_uniq2->expr, 0)) {
                break;
            }
        }
    }

    return i;
}